

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_group.h
# Opt level: O0

void __thiscall cppwinrt::task_group::get(task_group *this)

{
  bool bVar1;
  __basic_future<void> *this_00;
  reference this_01;
  __normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
  *__rhs;
  future<void> *task_1;
  iterator __end2_1;
  iterator __begin2_1;
  type *__range2_1;
  future<void> *task;
  iterator __end2;
  iterator __begin2;
  type *__range2;
  type tasks;
  task_group *this_local;
  
  tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::vector
            ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&__range2,
             &this->m_tasks);
  __end2 = std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::begin
                     ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&__range2);
  task = (future<void> *)
         std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::end
                   ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&__range2);
  while( true ) {
    __rhs = (__normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
             *)&task;
    bVar1 = __gnu_cxx::operator!=(&__end2,__rhs);
    if (!bVar1) break;
    this_00 = &__gnu_cxx::
               __normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
               ::operator*(&__end2)->super___basic_future<void>;
    std::__basic_future<void>::wait(this_00,__rhs);
    __gnu_cxx::
    __normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::begin
                       ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&__range2)
  ;
  task_1 = (future<void> *)
           std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::end
                     ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&__range2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
                        *)&task_1);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
              ::operator*(&__end2_1);
    std::future<void>::get(this_01);
    __gnu_cxx::
    __normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
    ::operator++(&__end2_1);
  }
  std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
            ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&__range2);
  return;
}

Assistant:

void get()
        {
            auto tasks = std::move(m_tasks);

            for (auto&& task : tasks)
            {
                task.wait();
            }

            for (auto&& task : tasks)
            {
                task.get();
            }
        }